

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O1

void __thiscall QLearning::QtableLogic(QLearning *this,int nn,int depth,int breadth)

{
  char cVar1;
  int iVar2;
  mapped_type *this_00;
  ulong uVar3;
  undefined4 in_register_00000034;
  QLearning *this_01;
  ulong uVar4;
  int one_dimensional_index;
  double dVar5;
  vector<int,_std::allocator<int>_> key;
  vector<float,_std::allocator<float>_> value;
  allocator_type local_85;
  uint local_84;
  uint local_80;
  float local_7c;
  int local_78;
  value_type_conflict1 local_74;
  QLearning *local_70;
  vector<int,_std::allocator<int>_> local_68;
  size_type local_50;
  void *local_48 [2];
  pointer local_38;
  
  this_01 = (QLearning *)CONCAT44(in_register_00000034,nn);
  uVar3 = (ulong)(uint)nn;
  local_84 = nn;
  local_80 = breadth;
  local_70 = this;
  if (nn == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size cannot be 0",0x10);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    this_01 = (QLearning *)(ulong)(uint)(int)cVar1;
    uVar3 = (ulong)local_84;
    std::ostream::put('(');
    std::ostream::flush();
  }
  dVar5 = pow((double)(int)uVar3,(double)depth);
  local_78 = (int)dVar5;
  if (0 < local_78) {
    local_7c = (float)((int)(uVar3 >> 0x1f) + (int)uVar3 >> 1);
    local_50 = (size_type)(int)local_80;
    local_70 = (QLearning *)&local_70->_q_table;
    uVar4 = (ulong)local_80;
    one_dimensional_index = 0;
    do {
      IndexFromMulti(&local_68,this_01,one_dimensional_index,(int)uVar3,depth);
      if (0 < depth) {
        uVar3 = 0;
        do {
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar3] =
               (int)((float)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3] - local_7c);
          uVar3 = uVar3 + 1;
        } while ((uint)depth != uVar3);
      }
      local_74 = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_48,local_50,&local_74,&local_85);
      if (0 < (int)local_80) {
        uVar3 = 0;
        do {
          iVar2 = rand();
          *(float *)((long)local_48[0] + uVar3 * 4) = (float)(iVar2 % 5 + 1);
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      this_00 = std::
                map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)local_70,&local_68);
      this_01 = (QLearning *)local_48;
      std::vector<float,_std::allocator<float>_>::operator=
                (this_00,(vector<float,_std::allocator<float>_> *)local_48);
      uVar3 = (ulong)local_84;
      if (local_48[0] != (void *)0x0) {
        this_01 = (QLearning *)((long)local_38 - (long)local_48[0]);
        operator_delete(local_48[0],(ulong)this_01);
      }
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        this_01 = (QLearning *)
                  ((long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                  (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)this_01);
      }
      one_dimensional_index = one_dimensional_index + 1;
    } while (one_dimensional_index != local_78);
  }
  return;
}

Assistant:

void QLearning::QtableLogic(int nn, int depth, int breadth)
{

    if (nn == 0)
    {
        std::cerr << "size cannot be 0" << std::endl;
    }

    float size = nn / 2;
    int max_index = pow(nn, depth);

    for (int i = 0; i < max_index; i++)
    {
        std::vector<int> key = IndexFromMulti(i, nn, depth);
        //change the interval [0,nn) to the interval [-size,size).
        for (int j = 0; j < depth; j++)
            key[j] -= size;

        //Fill in the value
        std::vector<float> value(breadth, 0);
        for (int j = 0; j < breadth; j++)
            value[j] = (rand() % 5) + 1;

        this->_q_table[key] = value;
    }
    //return q_table;
}